

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O2

void different_stl_string_references_are_not_equal(void)

{
  Constraint_ *pCVar1;
  allocator local_49;
  string alice;
  string bob;
  
  std::__cxx11::string::string((string *)&bob,"bob",(allocator *)&alice);
  std::__cxx11::string::string((string *)&alice,"alice",&local_49);
  pCVar1 = (Constraint_ *)cgreen::create_not_equal_to_string_constraint((string *)&alice,"alice");
  cgreen::assert_that_
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/cpp_assertion_tests.cpp"
             ,0x76,"bob",(string *)&bob,pCVar1);
  std::__cxx11::string::~string((string *)&alice);
  std::__cxx11::string::~string((string *)&bob);
  return;
}

Assistant:

Ensure(different_stl_string_references_are_not_equal) {
    std::string bob("bob");
    std::string alice("alice");
    assert_that(bob, is_not_equal_to_string(alice));
}